

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpg.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar8;
  int *piVar5;
  undefined7 extraout_var_01;
  int *extraout_RAX;
  int *extraout_RAX_00;
  ostream *poVar6;
  size_t sVar7;
  char *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char **ppcVar11;
  uint uVar12;
  string *input_stream;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  int num_order;
  int num_past_frame;
  vector<double,_std::allocator<double>_> coefficients_3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  window_coefficients;
  InputSourceFromStream input_source;
  vector<double,_std::allocator<double>_> smoothed_static_parameters;
  double magic_number;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  smoothed_static_parameters_1;
  ifstream ifs;
  vector<double,_std::allocator<double>_> coefficients;
  InputSourcePreprocessing preprocessed_source;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  variance_vectors;
  option long_options [2];
  undefined1 auStack_608 [4];
  int local_604;
  int local_600;
  int local_5fc;
  string local_5f8;
  char **local_5d8;
  undefined4 local_5cc;
  ulong local_5c8;
  ulong local_5c0;
  string local_5b8 [3];
  ios_base local_548 [272];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_438;
  InputSourceFromStream local_418;
  vector<double,_std::allocator<double>_> local_3f8;
  ulong local_3d8;
  double local_3d0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_3c8;
  string local_3b0;
  byte abStack_390 [80];
  ios_base local_340 [408];
  undefined1 local_1a8 [8];
  double *pdStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [2];
  bool local_178;
  bool local_170;
  InputSourceInterface local_b8;
  undefined4 local_b0;
  int local_ac;
  InputSourceFromStream *local_a8;
  undefined1 local_a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_98;
  option local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_600 = 0x19;
  local_5fc = 0x1e;
  local_438.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8 = 0;
  local_3d0 = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.flag = (int *)0x0;
  local_78.val = 1000;
  local_78._28_4_ = 0;
  local_78.name = "magic";
  local_78.has_arg = 1;
  local_78._12_4_ = 0;
  local_5c0 = 0;
  local_5c8 = 0;
  local_5cc = 0;
  local_604 = 0;
  local_5d8 = argv;
LAB_001039e2:
  paVar10 = &local_3b0.field_2;
  iVar4 = ya_getopt_long_only(argc,local_5d8,"l:m:s:q:d:D:r:R:h",&local_78,(int *)0x0);
  if (iVar4 < 100) {
    if (iVar4 != 0x44) {
      if (iVar4 == 0x52) {
        std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_5b8);
        bVar1 = sptk::ConvertStringToInteger(&local_3b0,(int *)local_1a8);
        if (bVar1) {
          bVar1 = sptk::IsInRange(local_1a8._0_4_,0,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != paVar10) {
            operator_delete(local_3b0._M_dataplus._M_p);
          }
          if (bVar1) {
            local_3d8 = (ulong)local_1a8 & 0xffffffff;
            goto LAB_00103e8e;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_3b0._M_dataplus._M_p != paVar10) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"The argument for the -R option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"in the range of ",0x10);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_3b0,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
        std::ostream::operator<<((ostream *)poVar6,1);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
        goto LAB_00104905;
      }
      if (iVar4 != -1) goto switchD_00103a23_caseD_65;
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"Too many input files",0x14);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
        goto LAB_00104905;
      }
      if (argc == ya_optind) {
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar9 = local_5d8[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"Cannot set translation mode",0x1b);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
        goto LAB_00104905;
      }
      input_stream = &local_3b0;
      std::ifstream::ifstream(input_stream);
      if ((pcVar9 == (char *)0x0) ||
         (std::ifstream::open((char *)&local_3b0,(_Ios_Openmode)pcVar9),
         (abStack_390[*(long *)(local_3b0._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          input_stream = (string *)&std::cin;
        }
        ppcVar11 = (char **)((long)local_600 + 1);
        sptk::InputSourceFromStream::InputSourceFromStream
                  (&local_418,false,
                   ((int)((ulong)((long)local_438.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_438.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x55555555 + 1) * (int)ppcVar11 * 2,(istream *)input_stream);
        local_b8._vptr_InputSourceInterface = (_func_int **)&PTR__InputSourceInterface_00118ad0;
        local_b0 = local_5cc;
        local_ac = (**(code **)(CONCAT44(local_418.super_InputSourceInterface.
                                         _vptr_InputSourceInterface._4_4_,
                                         (int)local_418.super_InputSourceInterface.
                                              _vptr_InputSourceInterface) + 0x10))(&local_418);
        local_ac = local_ac / 2;
        local_a0 = 1;
        local_a8 = &local_418;
        cVar2 = (**(code **)(CONCAT44(local_418.super_InputSourceInterface.
                                      _vptr_InputSourceInterface._4_4_,
                                      (int)local_418.super_InputSourceInterface.
                                           _vptr_InputSourceInterface) + 0x18))(&local_418);
        if (cVar2 == '\0') {
          local_a0 = 0;
        }
        if ((int)local_3d8 == 1) {
          sptk::NonrecursiveMaximumLikelihoodParameterGeneration::
          NonrecursiveMaximumLikelihoodParameterGeneration
                    ((NonrecursiveMaximumLikelihoodParameterGeneration *)local_1a8,local_600,
                     &local_438,(bool)((byte)local_5c0 & 1),local_3d0);
          if (local_170 == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,"Failed to initialize ",0x15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,"NonrecursiveMaximumLikelihoodParameterGeneration",0x30)
            ;
            local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"mlpg","");
            sptk::PrintErrorMessage(&local_5f8,(ostringstream *)local_5b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
              operator_delete(local_5f8._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
            std::ios_base::~ios_base(local_548);
            local_1a8 = (undefined1  [8])
                        &PTR__NonrecursiveMaximumLikelihoodParameterGeneration_00118b30;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)local_198);
            goto LAB_00104acb;
          }
          local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_5b8[0].field_2._M_allocated_capacity = (double *)0x0;
          local_5b8[0]._M_dataplus._M_p = (pointer)0x0;
          local_5b8[0]._M_string_length = 0;
          local_5d8 = ppcVar11;
          while (bVar1 = sptk::InputSourceFromStream::Get
                                   (&local_418,(vector<double,_std::allocator<double>_> *)local_5b8)
                , bVar1) {
            std::vector<double,std::allocator<double>>::
            vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                      ((vector<double,std::allocator<double>> *)&local_5f8,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                       local_5b8[0]._M_dataplus._M_p,
                       (double *)
                       ((long)local_5b8[0]._M_dataplus._M_p + (long)(local_418.read_size_ / 2) * 8),
                       (allocator_type *)&local_3c8);
            std::
            vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
            ::emplace_back<std::vector<double,std::allocator<double>>>
                      ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                        *)&local_3f8,(vector<double,_std::allocator<double>_> *)&local_5f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5f8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_5f8._M_dataplus._M_p);
            }
            std::vector<double,std::allocator<double>>::
            vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                      ((vector<double,std::allocator<double>> *)&local_5f8,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                       (local_5b8[0]._M_dataplus._M_p + (long)(local_418.read_size_ / 2) * 8),
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                       local_5b8[0]._M_string_length,(allocator_type *)&local_3c8);
            std::
            vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
            ::emplace_back<std::vector<double,std::allocator<double>>>
                      ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                        *)&local_98,(vector<double,_std::allocator<double>_> *)&local_5f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5f8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_5f8._M_dataplus._M_p);
            }
          }
          if ((double *)local_5b8[0]._M_dataplus._M_p != (double *)0x0) {
            operator_delete(local_5b8[0]._M_dataplus._M_p);
          }
          local_3c8.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3c8.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3c8.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar1 = sptk::NonrecursiveMaximumLikelihoodParameterGeneration::Run
                            ((NonrecursiveMaximumLikelihoodParameterGeneration *)local_1a8,
                             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)&local_3f8,&local_98,&local_3c8);
          ppcVar11 = local_5d8;
          if (bVar1) {
            uVar12 = (int)((long)local_3c8.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_3c8.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
            bVar1 = true;
            if (0 < (int)uVar12) {
              uVar13 = (ulong)(uVar12 & 0x7fffffff);
              lVar14 = 0;
              do {
                bVar3 = sptk::WriteStream<double>
                                  (0,(int)ppcVar11,
                                   (vector<double,_std::allocator<double>_> *)
                                   ((long)&((local_3c8.
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_start + lVar14),
                                   (ostream *)&std::cout,(int *)0x0);
                if (!bVar3) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_5b8,"Failed to write static parameters",0x21);
                  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"mlpg","");
                  sptk::PrintErrorMessage(&local_5f8,(ostringstream *)local_5b8);
                  goto LAB_00104fd0;
                }
                lVar14 = lVar14 + 0x18;
                uVar13 = uVar13 - 1;
              } while (uVar13 != 0);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,"Failed to perform MLPG",0x16);
            local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"mlpg","");
            sptk::PrintErrorMessage(&local_5f8,(ostringstream *)local_5b8);
LAB_00104fd0:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
              operator_delete(local_5f8._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
            std::ios_base::~ios_base(local_548);
            local_604 = 1;
            bVar1 = false;
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_3c8);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_98);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)&local_3f8);
          local_1a8 = (undefined1  [8])
                      &PTR__NonrecursiveMaximumLikelihoodParameterGeneration_00118b30;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)local_198);
          if (bVar1) goto LAB_0010504b;
          goto LAB_00105053;
        }
        if ((int)local_3d8 != 0) goto LAB_0010504b;
        if ((local_5c0 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5b8,"Magic number is not supported on recursive mode",0x2f);
          local_1a8 = (undefined1  [8])local_198;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"mlpg","");
          sptk::PrintErrorMessage((string *)local_1a8,(ostringstream *)local_5b8);
          goto LAB_00104a9b;
        }
        sptk::RecursiveMaximumLikelihoodParameterGeneration::
        RecursiveMaximumLikelihoodParameterGeneration
                  ((RecursiveMaximumLikelihoodParameterGeneration *)local_1a8,local_600,local_5fc,
                   &local_438,&local_b8);
        if (local_178 == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5b8,
                     "Failed to initialize RecursiveMaximumLikelihoodParameterGeneration",0x42);
          local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"mlpg","");
          sptk::PrintErrorMessage(&local_5f8,(ostringstream *)local_5b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
            operator_delete(local_5f8._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
          std::ios_base::~ios_base(local_548);
          sptk::RecursiveMaximumLikelihoodParameterGeneration::
          ~RecursiveMaximumLikelihoodParameterGeneration
                    ((RecursiveMaximumLikelihoodParameterGeneration *)local_1a8);
          goto LAB_00104acb;
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_3f8,(size_type)ppcVar11,(allocator_type *)local_5b8);
        goto LAB_00104c52;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b8,"Cannot open file ",0x11);
      sVar7 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,pcVar9,sVar7);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"mlpg","");
      sptk::PrintErrorMessage((string *)local_1a8,(ostringstream *)local_5b8);
LAB_00104a9b:
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
      std::ios_base::~ios_base(local_548);
LAB_00104acb:
      local_604 = 1;
      goto LAB_00105053;
    }
    if ((local_5c8 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"-D and -r options cannot be specified at the same time",0x36
                );
      local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
      sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
      goto LAB_00104905;
    }
    std::ifstream::ifstream(&local_3b0);
    std::ifstream::open((char *)&local_3b0,(_Ios_Openmode)ya_optarg);
    if ((abStack_390[*(long *)(local_3b0._M_dataplus._M_p + -0x18)] & 5) == 0) {
      local_5b8[0]._M_dataplus._M_p = (pointer)0x0;
      local_5b8[0]._M_string_length = 0;
      local_5b8[0].field_2._M_allocated_capacity = (double *)0x0;
      while (bVar1 = sptk::ReadStream<double>((double *)local_1a8,(istream *)&local_3b0), bVar1) {
        if (local_5b8[0]._M_string_length == local_5b8[0].field_2._M_allocated_capacity) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)local_5b8,
                     (iterator)local_5b8[0]._M_string_length,(double *)local_1a8);
        }
        else {
          *(undefined1 (*) [8])local_5b8[0]._M_string_length = local_1a8;
          local_5b8[0]._M_string_length = local_5b8[0]._M_string_length + 8;
        }
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_438,(value_type *)local_5b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8[0]._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_5b8[0]._M_dataplus._M_p);
      }
      std::ifstream::~ifstream(&local_3b0);
LAB_00103e8e:
      bVar3 = true;
      goto LAB_001041fe;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"Cannot open file ",0x11);
    pcVar9 = ya_optarg;
    if (ya_optarg == (char *)0x0) {
      std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_5b8[0]._M_dataplus._M_p + -0x18)
                      + 0x50);
    }
    else {
      sVar7 = strlen(ya_optarg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,pcVar9,sVar7);
    }
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"mlpg","");
    sptk::PrintErrorMessage((string *)local_1a8,(ostringstream *)local_5b8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
    std::ios_base::~ios_base(local_548);
    std::ifstream::~ifstream(&local_3b0);
  }
  else {
    switch(iVar4) {
    case 100:
      if ((local_5c8 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"-d and -r options cannot be specified at the same time",
                   0x36);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
        break;
      }
      local_1a8 = (undefined1  [8])0x0;
      pdStack_1a0 = (double *)0x0;
      local_198[0]._M_allocated_capacity = (double *)0x0;
      std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_5b8);
      bVar3 = sptk::ConvertStringToDouble(&local_3b0,(double *)&local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar10) {
        operator_delete(local_3b0._M_dataplus._M_p);
      }
      if (bVar3) {
        if (pdStack_1a0 == (double *)local_198[0]._0_8_) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)local_1a8,(iterator)pdStack_1a0,
                     (double *)&local_418);
        }
        else {
          *pdStack_1a0 = (double)CONCAT44(local_418.super_InputSourceInterface.
                                          _vptr_InputSourceInterface._4_4_,
                                          (int)local_418.super_InputSourceInterface.
                                               _vptr_InputSourceInterface);
          pdStack_1a0 = pdStack_1a0 + 1;
        }
        for (; ya_optind < argc; ya_optind = ya_optind + 1) {
          std::__cxx11::string::string
                    ((string *)&local_3b0,local_5d8[ya_optind],(allocator *)local_5b8);
          bVar1 = sptk::ConvertStringToDouble(&local_3b0,(double *)&local_418);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != paVar10) {
            operator_delete(local_3b0._M_dataplus._M_p);
          }
          if (!bVar1) break;
          if (pdStack_1a0 == (double *)local_198[0]._0_8_) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)local_1a8,(iterator)pdStack_1a0,
                       (double *)&local_418);
          }
          else {
            *pdStack_1a0 = (double)CONCAT44(local_418.super_InputSourceInterface.
                                            _vptr_InputSourceInterface._4_4_,
                                            (int)local_418.super_InputSourceInterface.
                                                 _vptr_InputSourceInterface);
            pdStack_1a0 = pdStack_1a0 + 1;
          }
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&local_438,(value_type *)local_1a8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"The argument for the -d option must be numeric",0x2e);
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
          operator_delete(local_5b8[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b0);
        std::ios_base::~ios_base(local_340);
        local_604 = 1;
      }
      if (local_1a8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1a8);
      }
LAB_001041fe:
      if (bVar3 == false) goto LAB_00104942;
      goto LAB_001039e2;
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
switchD_00103a23_caseD_65:
      local_604 = 1;
      anon_unknown.dwarf_4023::PrintUsage((ostream *)&std::cerr);
      goto LAB_00104942;
    case 0x68:
      local_604 = 0;
      anon_unknown.dwarf_4023::PrintUsage((ostream *)&std::cout);
      goto LAB_00104942;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_5b8);
      bVar3 = sptk::ConvertStringToInteger(&local_3b0,&local_600);
      bVar1 = 0 < local_600;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p);
      }
      if (bVar3 && bVar1) {
        local_600 = local_600 + -1;
        bVar3 = true;
        goto LAB_001041fe;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"The argument for the -l option must be a positive integer",
                 0x39);
      local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
      sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_5b8);
      bVar1 = sptk::ConvertStringToInteger(&local_3b0,&local_600);
      bVar15 = -1 < local_600;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p);
      }
      bVar3 = true;
      if (bVar1 && bVar15) goto LAB_001041fe;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"non-negative integer",0x14);
      local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
      sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
      break;
    case 0x71:
      std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_5b8);
      bVar1 = sptk::ConvertStringToInteger(&local_3b0,(int *)local_1a8);
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_1a8._0_4_,0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != paVar10) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        if (bVar1) {
          local_5cc = local_1a8._0_4_;
          goto LAB_00103e8e;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b0._M_dataplus._M_p != paVar10) {
        operator_delete(local_3b0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"The argument for the -q option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"in the range of ",0x10);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_3b0,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
      std::ostream::operator<<((ostream *)poVar6,2);
      local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
      sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
      break;
    case 0x72:
      if ((local_5c8 & 1) == 0) {
        local_1a8 = (undefined1  [8])0x0;
        pdStack_1a0 = (double *)0x0;
        local_198[0]._M_allocated_capacity = (double *)0x0;
        std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_5b8);
        bVar1 = sptk::ConvertStringToInteger(&local_3b0,(int *)&local_418);
        if (bVar1) {
          bVar1 = sptk::ComputeFirstOrderRegressionCoefficients
                            ((int)local_418.super_InputSourceInterface._vptr_InputSourceInterface,
                             (vector<double,_std::allocator<double>_> *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != paVar10) {
            operator_delete(local_3b0._M_dataplus._M_p);
          }
          if (!bVar1) goto LAB_00103ea8;
          bVar1 = true;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&local_438,(value_type *)local_1a8);
        }
        else {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != paVar10) {
            operator_delete(local_3b0._M_dataplus._M_p);
          }
LAB_00103ea8:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3b0,
                     "The argument for the -r option must be positive integer(s)",0x3a);
          local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
          sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
            operator_delete(local_5b8[0]._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b0);
          std::ios_base::~ios_base(local_340);
          local_604 = 1;
          bVar1 = false;
        }
        if (local_1a8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1a8);
        }
        if (bVar1) {
          piVar5 = (int *)(long)ya_optind;
          if (ya_optind < argc) {
            std::__cxx11::string::string
                      ((string *)&local_3b0,local_5d8[(long)piVar5],(allocator *)local_5b8);
            bVar1 = sptk::ConvertStringToInteger(&local_3b0,(int *)&local_418);
            piVar5 = (int *)CONCAT71(extraout_var_01,bVar1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != paVar10) {
              operator_delete(local_3b0._M_dataplus._M_p);
              piVar5 = extraout_RAX;
            }
            if (bVar1) {
              local_1a8 = (undefined1  [8])0x0;
              pdStack_1a0 = (double *)0x0;
              local_198[0]._M_allocated_capacity = (double *)0x0;
              bVar1 = sptk::ComputeSecondOrderRegressionCoefficients
                                ((int)local_418.super_InputSourceInterface.
                                      _vptr_InputSourceInterface,
                                 (vector<double,_std::allocator<double>_> *)local_1a8);
              if (bVar1) {
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::push_back(&local_438,(value_type *)local_1a8);
                piVar5 = &ya_optind;
                ya_optind = ya_optind + 1;
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_3b0,
                           "The argument for the -r option must be positive integer(s)",0x3a);
                local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
                sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
                  operator_delete(local_5b8[0]._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b0);
                piVar5 = (int *)std::ios_base::~ios_base(local_340);
                local_604 = 1;
              }
              if (local_1a8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_1a8);
                piVar5 = extraout_RAX_00;
              }
              if (!bVar1) goto LAB_00104942;
            }
          }
          bVar3 = true;
          local_5c8 = CONCAT71((int7)((ulong)piVar5 >> 8),1);
          goto LAB_001041fe;
        }
        goto LAB_00104942;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"-r option cannot be specified multiple times",0x2c);
      local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
      sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
      break;
    case 0x73:
      std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_5b8);
      bVar1 = sptk::ConvertStringToInteger(&local_3b0,&local_5fc);
      bVar15 = -1 < local_5fc;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p);
      }
      bVar3 = true;
      if (bVar1 && bVar15) goto LAB_001041fe;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"The argument for the -s option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"non-negative integer",0x14);
      local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
      sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
      break;
    default:
      if (iVar4 != 1000) goto switchD_00103a23_caseD_65;
      std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_5b8);
      bVar1 = sptk::ConvertStringToDouble(&local_3b0,&local_3d0);
      uVar8 = extraout_var;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar10) {
        operator_delete(local_3b0._M_dataplus._M_p);
        uVar8 = extraout_var_00;
      }
      bVar3 = true;
      local_5c0 = CONCAT71(uVar8,1);
      if (bVar1) goto LAB_001041fe;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"The argument for the -magic option must be a number",0x33);
      local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"mlpg","");
      sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_3b0);
    }
LAB_00104905:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
      operator_delete(local_5b8[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b0);
    std::ios_base::~ios_base(local_340);
  }
  local_604 = 1;
  goto LAB_00104942;
  while (bVar3 = sptk::WriteStream<double>
                           (0,(int)ppcVar11,&local_3f8,(ostream *)&std::cout,(int *)0x0), bVar3) {
LAB_00104c52:
    bVar1 = sptk::RecursiveMaximumLikelihoodParameterGeneration::Get
                      ((RecursiveMaximumLikelihoodParameterGeneration *)local_1a8,&local_3f8);
    if (!bVar1) goto LAB_00104d03;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5b8,"Failed to write static parameters",0x21);
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"mlpg","");
  sptk::PrintErrorMessage(&local_5f8,(ostringstream *)local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
  std::ios_base::~ios_base(local_548);
  local_604 = 1;
LAB_00104d03:
  if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  sptk::RecursiveMaximumLikelihoodParameterGeneration::
  ~RecursiveMaximumLikelihoodParameterGeneration
            ((RecursiveMaximumLikelihoodParameterGeneration *)local_1a8);
  if (!bVar1) {
LAB_0010504b:
    local_604 = 0;
  }
LAB_00105053:
  std::ifstream::~ifstream(&local_3b0);
LAB_00104942:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_438);
  return local_604;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  int num_past_frame(kDefaultNumPastFrame);
  InputFormats input_format(kDefaultInputFormat);
  std::vector<std::vector<double> > window_coefficients;
  bool is_regression_specified(false);
  double magic_number(0.0);
  bool is_magic_number_specified(false);
  Modes mode(kDefaultMode);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:s:q:d:D:r:R:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &num_past_frame) ||
            num_past_frame < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'd': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-d and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        std::vector<double> coefficients;
        double coefficient;
        if (!sptk::ConvertStringToDouble(optarg, &coefficient)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be numeric";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        coefficients.push_back(coefficient);
        while (optind < argc &&
               sptk::ConvertStringToDouble(argv[optind], &coefficient)) {
          coefficients.push_back(coefficient);
          ++optind;
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'D': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-D and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        std::ifstream ifs;
        ifs.open(optarg, std::ios::in | std::ios::binary);
        if (ifs.fail()) {
          std::ostringstream error_message;
          error_message << "Cannot open file " << optarg;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        std::vector<double> coefficients;
        double coefficient;
        while (sptk::ReadStream(&coefficient, &ifs)) {
          coefficients.push_back(coefficient);
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'r': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message << "-r option cannot be specified multiple times";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        int n;
        // Set first order coefficients.
        {
          std::vector<double> coefficients;
          if (!sptk::ConvertStringToInteger(optarg, &n) ||
              !sptk::ComputeFirstOrderRegressionCoefficients(n,
                                                             &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("mlpg", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
        }

        // Set second order coefficients.
        if (optind < argc && sptk::ConvertStringToInteger(argv[optind], &n)) {
          std::vector<double> coefficients;
          if (!sptk::ComputeSecondOrderRegressionCoefficients(n,
                                                              &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("mlpg", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
          ++optind;
        }
        is_regression_specified = true;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'R': {
        const int min(0);
        const int max(static_cast<int>(kNumModes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -R option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        mode = static_cast<Modes>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mlpg", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mlpg", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int static_size(num_order + 1);
  const int read_size(2 * static_size *
                      static_cast<int>(window_coefficients.size() + 1));
  sptk::InputSourceFromStream input_source(false, read_size, &input_stream);
  InputSourcePreprocessing preprocessed_source(input_format, &input_source);

  if (kRecursive == mode) {
    if (is_magic_number_specified) {
      std::ostringstream error_message;
      error_message << "Magic number is not supported on recursive mode";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    sptk::RecursiveMaximumLikelihoodParameterGeneration generation(
        num_order, num_past_frame, window_coefficients, &preprocessed_source);
    if (!generation.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize "
                       "RecursiveMaximumLikelihoodParameterGeneration";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    std::vector<double> smoothed_static_parameters(static_size);
    while (generation.Get(&smoothed_static_parameters)) {
      if (!sptk::WriteStream(0, static_size, smoothed_static_parameters,
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write static parameters";
        sptk::PrintErrorMessage("mlpg", error_message);
        return 1;
      }
    }
  } else if (kNonrecursive == mode) {
    sptk::NonrecursiveMaximumLikelihoodParameterGeneration generation(
        num_order, window_coefficients, is_magic_number_specified,
        magic_number);
    if (!generation.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize "
                    << "NonrecursiveMaximumLikelihoodParameterGeneration";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    std::vector<std::vector<double> > mean_vectors;
    std::vector<std::vector<double> > variance_vectors;
    {
      const int size(input_source.GetSize() / 2);
      std::vector<double> tmp;
      while (input_source.Get(&tmp)) {
        mean_vectors.push_back(
            std::vector<double>(tmp.begin(), tmp.begin() + size));
        variance_vectors.push_back(
            std::vector<double>(tmp.begin() + size, tmp.end()));
      }
    }

    std::vector<std::vector<double> > smoothed_static_parameters;
    if (!generation.Run(mean_vectors, variance_vectors,
                        &smoothed_static_parameters)) {
      std::ostringstream error_message;
      error_message << "Failed to perform MLPG";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    const int sequence_length(
        static_cast<int>(smoothed_static_parameters.size()));
    for (int t(0); t < sequence_length; ++t) {
      if (!sptk::WriteStream(0, static_size, smoothed_static_parameters[t],
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write static parameters";
        sptk::PrintErrorMessage("mlpg", error_message);
        return 1;
      }
    }
  }

  return 0;
}